

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

int __thiscall
QAbstractScrollAreaScrollBarContainer::scrollBarLayoutIndex
          (QAbstractScrollAreaScrollBarContainer *this)

{
  int iVar1;
  long *plVar2;
  QObject *object;
  QScrollBar *pQVar3;
  int iVar4;
  
  iVar1 = (**(code **)(*(long *)&this->layout->super_QLayout + 200))();
  iVar4 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  while( true ) {
    if (iVar1 == iVar4) {
      return -1;
    }
    plVar2 = (long *)(**(code **)(*(long *)&this->layout->super_QLayout + 0xa8))(this->layout,iVar4)
    ;
    object = (QObject *)(**(code **)(*plVar2 + 0x68))(plVar2);
    pQVar3 = QtPrivate::qobject_cast_helper<QScrollBar*,QObject>(object);
    if (pQVar3 != (QScrollBar *)0x0) break;
    iVar4 = iVar4 + 1;
  }
  return iVar4;
}

Assistant:

int QAbstractScrollAreaScrollBarContainer::scrollBarLayoutIndex() const
{
    const int layoutItemCount = layout->count();
    for (int i = 0; i < layoutItemCount; ++i) {
        if (qobject_cast<QScrollBar *>(layout->itemAt(i)->widget()))
            return i;
    }
    return -1;
}